

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

void __thiscall
t_d_generator::print_server_skeleton(t_d_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  pointer pptVar4;
  string svc_name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  suffix_if_reserved(&local_e8,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(out,"/*");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           " * This auto-generated skeleton file illustrates how to build a server. If you"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           " * intend to customize it, you should edit a copy with another file name to "
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," * avoid overwriting it when running the generator again.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," */");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"module ");
  render_package_abi_cxx11_(&local_148,this,(tservice->super_t_type).program_);
  poVar3 = std::operator<<(poVar3,(string *)&local_148);
  poVar3 = std::operator<<(poVar3,(string *)&local_e8);
  poVar3 = std::operator<<(poVar3,"_server;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import std.stdio;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import thrift.codegen.processor;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import thrift.protocol.binary;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import thrift.server.simple;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import thrift.server.transport.socket;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import thrift.transport.buffered;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import thrift.util.hashset;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import ");
  render_package_abi_cxx11_(&local_108,this,(tservice->super_t_type).program_);
  poVar3 = std::operator<<(poVar3,(string *)&local_108);
  poVar3 = std::operator<<(poVar3,(string *)&local_e8);
  poVar3 = std::operator<<(poVar3,";");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"import ");
  render_package_abi_cxx11_
            (&local_128,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar3 = std::operator<<(poVar3,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar3 = std::operator<<(poVar3,"_types;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"class ");
  poVar3 = std::operator<<(poVar3,(string *)&local_e8);
  poVar3 = std::operator<<(poVar3,"Handler : ");
  poVar3 = std::operator<<(poVar3,(string *)&local_e8);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_148);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_148);
  poVar3 = std::operator<<(poVar3,"this() {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_108);
  poVar3 = std::operator<<(poVar3,"  // Your initialization goes here.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_c8,&tservice->functions_)
  ;
  for (pptVar4 = local_c8._M_impl.super__Vector_impl_data._M_start;
      pptVar4 != local_c8._M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
    std::operator<<(out,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    print_function_signature(this,out,*pptVar4);
    poVar3 = std::operator<<(out," {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_148);
    poVar3 = std::operator<<(poVar3,"// Your implementation goes here.");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_108);
    poVar3 = std::operator<<(poVar3,"writeln(\"");
    suffix_if_reserved(&local_128,&(*pptVar4)->name_);
    poVar3 = std::operator<<(poVar3,(string *)&local_128);
    poVar3 = std::operator<<(poVar3," called\");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_148);
    iVar2 = (*((*pptVar4)->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar2 == '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"return typeof(return).init;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_148);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_148);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<(out,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_148);
  poVar3 = std::operator<<(poVar3,"void main() {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_148);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_148);
  poVar3 = std::operator<<(poVar3,"auto protocolFactory = new TBinaryProtocolFactory!();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_108);
  poVar3 = std::operator<<(poVar3,"auto processor = new TServiceProcessor!");
  poVar3 = std::operator<<(poVar3,(string *)&local_e8);
  poVar3 = std::operator<<(poVar3,"(new ");
  poVar3 = std::operator<<(poVar3,(string *)&local_e8);
  poVar3 = std::operator<<(poVar3,"Handler);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"auto serverTransport = new TServerSocket(9090);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"auto transportFactory = new TBufferedTransportFactory;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"auto server = new TSimpleServer(");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,
                           "  processor, serverTransport, transportFactory, protocolFactory);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_b0);
  poVar3 = std::operator<<(poVar3,"server.serve();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_148);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<(out,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void print_server_skeleton(ostream& out, t_service* tservice) {
    string svc_name = suffix_if_reserved(tservice->get_name());

    out << "/*" << endl
        << " * This auto-generated skeleton file illustrates how to build a server. If you" << endl
        << " * intend to customize it, you should edit a copy with another file name to " << endl
        << " * avoid overwriting it when running the generator again." << endl << " */" << endl
        << "module " << render_package(*tservice->get_program()) << svc_name << "_server;" << endl
        << endl << "import std.stdio;" << endl << "import thrift.codegen.processor;" << endl
        << "import thrift.protocol.binary;" << endl << "import thrift.server.simple;" << endl
        << "import thrift.server.transport.socket;" << endl << "import thrift.transport.buffered;"
        << endl << "import thrift.util.hashset;" << endl << endl << "import "
        << render_package(*tservice->get_program()) << svc_name << ";" << endl << "import "
        << render_package(*get_program()) << program_name_ << "_types;" << endl << endl << endl
        << "class " << svc_name << "Handler : " << svc_name << " {" << endl;

    indent_up();
    out << indent() << "this() {" << endl << indent() << "  // Your initialization goes here."
        << endl << indent() << "}" << endl << endl;

    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator f_iter;
    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      out << indent();
      print_function_signature(out, *f_iter);
      out << " {" << endl;

      indent_up();

      out << indent() << "// Your implementation goes here." << endl << indent() << "writeln(\""
          << suffix_if_reserved((*f_iter)->get_name()) << " called\");" << endl;

	  t_type* rt = (*f_iter)->get_returntype();
	  if (!rt->is_void()) {
        indent(out) << "return typeof(return).init;" << endl;
      }

      indent_down();

      out << indent() << "}" << endl << endl;
    }

    indent_down();
    out << "}" << endl << endl;

    out << indent() << "void main() {" << endl;
    indent_up();
    out << indent() << "auto protocolFactory = new TBinaryProtocolFactory!();" << endl << indent()
        << "auto processor = new TServiceProcessor!" << svc_name << "(new " << svc_name
        << "Handler);" << endl << indent() << "auto serverTransport = new TServerSocket(9090);"
        << endl << indent() << "auto transportFactory = new TBufferedTransportFactory;" << endl
        << indent() << "auto server = new TSimpleServer(" << endl << indent()
        << "  processor, serverTransport, transportFactory, protocolFactory);" << endl << indent()
        << "server.serve();" << endl;
    indent_down();
    out << "}" << endl;
  }